

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::write_escaped_cp<fmt::v10::appender,char>
                   (appender out,find_escape_result<char> *escape)

{
  long lVar1;
  byte *pbVar2;
  appender aVar3;
  uint cp;
  ulong uVar4;
  byte *pbVar5;
  
  cp = escape->cp;
  if ((int)cp < 0x22) {
    if (cp == 9) {
      uVar4 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container + 0x10) + 1;
      cp = 0x74;
    }
    else if (cp == 10) {
      uVar4 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container + 0x10) + 1;
      cp = 0x6e;
    }
    else {
      if (cp != 0xd) goto LAB_002102f1;
      uVar4 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container + 0x10) + 1;
      cp = 0x72;
    }
  }
  else {
    if (((cp != 0x22) && (cp != 0x27)) && (cp != 0x5c)) {
LAB_002102f1:
      if (cp < 0x100) {
        aVar3 = write_codepoint<2ul,char,fmt::v10::appender>(out,'x',cp);
        return (appender)aVar3.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
        ;
      }
      if (cp < 0x10000) {
        aVar3 = write_codepoint<4ul,char,fmt::v10::appender>(out,'u',cp);
        return (appender)aVar3.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
        ;
      }
      if (cp < 0x110000) {
        aVar3 = write_codepoint<8ul,char,fmt::v10::appender>(out,'U',cp);
        return (appender)aVar3.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
        ;
      }
      pbVar5 = (byte *)escape->begin;
      pbVar2 = (byte *)escape->end;
      if (-1 < (long)pbVar2 - (long)pbVar5) {
        for (; pbVar2 != pbVar5; pbVar5 = pbVar5 + 1) {
          out = write_codepoint<2ul,char,fmt::v10::appender>(out,'x',(uint)*pbVar5);
        }
        return (appender)
               out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
      }
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/core.h"
                  ,0x189,"negative value");
    }
    uVar4 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10) + 1;
  }
  if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x18) < uVar4) {
    (*(code *)**(undefined8 **)
                out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
              (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
  }
  lVar1 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                   + 0x10);
  *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container + 0x10)
       = lVar1 + 1;
  *(undefined1 *)
   (*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container + 8) +
   lVar1) = 0x5c;
  if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x18) <
      *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
               0x10) + 1U) {
    (*(code *)**(undefined8 **)
                out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
              (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
  }
  lVar1 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                   + 0x10);
  *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container + 0x10)
       = lVar1 + 1;
  *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 8) + lVar1) = (char)cp;
  return (appender)
         out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

auto write_escaped_cp(OutputIt out, const find_escape_result<Char>& escape)
    -> OutputIt {
  auto c = static_cast<Char>(escape.cp);
  switch (escape.cp) {
  case '\n':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('n');
    break;
  case '\r':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('r');
    break;
  case '\t':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('t');
    break;
  case '"':
    FMT_FALLTHROUGH;
  case '\'':
    FMT_FALLTHROUGH;
  case '\\':
    *out++ = static_cast<Char>('\\');
    break;
  default:
    if (escape.cp < 0x100) {
      return write_codepoint<2, Char>(out, 'x', escape.cp);
    }
    if (escape.cp < 0x10000) {
      return write_codepoint<4, Char>(out, 'u', escape.cp);
    }
    if (escape.cp < 0x110000) {
      return write_codepoint<8, Char>(out, 'U', escape.cp);
    }
    for (Char escape_char : basic_string_view<Char>(
             escape.begin, to_unsigned(escape.end - escape.begin))) {
      out = write_codepoint<2, Char>(out, 'x',
                                     static_cast<uint32_t>(escape_char) & 0xFF);
    }
    return out;
  }
  *out++ = c;
  return out;
}